

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_selection_bvec2(ShaderEvalContext *c)

{
  float fVar1;
  undefined8 uVar2;
  Vector<bool,_2> *v;
  Vector<bool,_2> local_56;
  Vector<bool,_2> local_54;
  Vector<bool,_2> local_52;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  VecAccess<float,_4,_2> local_28;
  
  fVar1 = c->in[0].m_data[2];
  uVar2 = *(undefined8 *)c->in[1].m_data;
  local_38.m_data[1] = (float)uVar2;
  local_38.m_data[0] = (float)((ulong)uVar2 >> 0x20);
  local_40.m_data[0] = 0.0;
  local_40.m_data[1] = 0.0;
  tcu::greaterThan<float,2>(&local_38,&local_40);
  uVar2 = *(undefined8 *)(c->in[2].m_data + 1);
  local_48.m_data[1] = (float)uVar2;
  local_48.m_data[0] = (float)((ulong)uVar2 >> 0x20);
  local_50.m_data[0] = 0.0;
  local_50.m_data[1] = 0.0;
  tcu::greaterThan<float,2>(&local_48,&local_50);
  v = &local_56;
  if (0.0 < fVar1) {
    v = &local_54;
  }
  tcu::Vector<bool,_2>::Vector(&local_52,v);
  tcu::Vector<bool,_2>::cast<float>(&local_52);
  local_28.m_vector = &c->color;
  local_28.m_index[0] = 1;
  local_28.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_28,&local_30);
  return;
}

Assistant:

void eval_selection_bvec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(1, 0), Vec2(0.0f, 0.0f)),					greaterThan(c.in[2].swizzle(2, 1), Vec2(0.0f, 0.0f))).asFloat(); }